

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall VertexAttrib64Bit::ApiErrorsTest::invalidEnum(ApiErrorsTest *this,bool *result)

{
  ostream *poVar1;
  char *pcVar2;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream message;
  ostream local_198;
  GLenum local_20;
  uint local_1c;
  GLenum type;
  GLuint i;
  bool *result_local;
  ApiErrorsTest *this_local;
  
  _type = result;
  result_local = (bool *)this;
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    local_20 = invalidEnum::type_array[local_1c];
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(&local_198,"VertexAttribLPointer(..., ");
    pcVar2 = glu::getTypeName(local_20);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1," /* type */, ...)");
    (*(this->super_Base).gl.vertexAttribLPointer)(1,4,local_20,0,(void *)0x0);
    std::__cxx11::stringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    verifyError(this,0x500,pcVar2,0x19e,_type);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  (*(this->super_Base).gl.vertexAttribLPointer)(1,4,0x140a,0,(void *)0x0);
  verifyError(this,0,"VertexAttribLPointer(..., GL_DOUBLE /* type */, ...)",0x1a2,_type);
  return;
}

Assistant:

void ApiErrorsTest::invalidEnum(bool& result)
{
	/*
	 *b) GL_INVALID_ENUM should be generated by glVertexAttribLPointer()
	 *   if <type> is not GL_DOUBLE;
	 */

	static const GLenum type_array[] = { GL_BYTE,
										 GL_UNSIGNED_BYTE,
										 GL_SHORT,
										 GL_UNSIGNED_SHORT,
										 GL_INT,
										 GL_UNSIGNED_INT,
										 GL_HALF_FLOAT,
										 GL_FLOAT,
										 GL_FIXED,
										 GL_INT_2_10_10_10_REV,
										 GL_UNSIGNED_INT_2_10_10_10_REV,
										 GL_UNSIGNED_INT_10F_11F_11F_REV };
	static const GLuint type_array_length = sizeof(type_array) / sizeof(type_array[0]);

	for (GLuint i = 0; i < type_array_length; ++i)
	{
		const GLenum type = type_array[i];

		std::stringstream message;
		message << "VertexAttribLPointer(..., " << glu::getTypeName(type) << " /* type */, ...)";

		gl.vertexAttribLPointer(1 /*index */, 4 /*size */, type, 0 /* stride */, 0 /* pointer */);
		verifyError(GL_INVALID_ENUM, message.str().c_str(), __LINE__, result);
	}

	gl.vertexAttribLPointer(1 /* index */, 4 /*size */, GL_DOUBLE, 0 /* stride */, 0 /* pointer */);
	verifyError(GL_NO_ERROR, "VertexAttribLPointer(..., GL_DOUBLE /* type */, ...)", __LINE__, result);
}